

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcie_cfg_read.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ssize_t sVar2;
  char **in_RSI;
  int in_EDI;
  nettlp_pcie_cfg ntpc;
  uint16_t addr;
  int size;
  char buf [2048];
  int ch;
  int ret;
  nettlp_pcie_cfg *in_stack_fffffffffffff7c8;
  int len;
  void *in_stack_fffffffffffff7d0;
  undefined1 auStack_828 [10];
  undefined2 local_81e;
  uint local_81c;
  undefined1 local_818 [8];
  size_t in_stack_fffffffffffff7f0;
  void *in_stack_fffffffffffff7f8;
  uint16_t in_stack_fffffffffffff806;
  nettlp_pcie_cfg *in_stack_fffffffffffff808;
  
  local_81c = 0;
  local_81e = 0;
  memset(local_818,0,0x800);
  memset(&stack0xfffffffffffff7d4,0,0xc);
  while (iVar1 = getopt(in_EDI,in_RSI,"r:l:a:s:h"), iVar1 != -1) {
    in_stack_fffffffffffff7c8 = (nettlp_pcie_cfg *)(ulong)(iVar1 - 0x61);
    switch(in_stack_fffffffffffff7c8) {
    case (nettlp_pcie_cfg *)0x0:
      iVar1 = __isoc99_sscanf(_optarg,"0x%hx",&local_81e);
      if (iVar1 < 1) {
        fprintf(_stderr,"invalid address\n");
        return -1;
      }
      break;
    case (nettlp_pcie_cfg *)0x7:
    default:
      usage();
      return -1;
    case (nettlp_pcie_cfg *)0xb:
      iVar1 = inet_pton(2,_optarg,auStack_828);
      if (iVar1 < 1) {
        perror("inet_pton");
        return -1;
      }
      break;
    case (nettlp_pcie_cfg *)0x11:
      iVar1 = inet_pton(2,_optarg,&stack0xfffffffffffff7d4);
      if (iVar1 < 1) {
        perror("inet_pton");
        return -1;
      }
      break;
    case (nettlp_pcie_cfg *)0x12:
      local_81c = atoi(_optarg);
      if (((int)local_81c < 1) || (0x800 < local_81c)) {
        fprintf(_stderr,"invalid size\n");
        return -1;
      }
    }
  }
  iVar1 = nettlp_pcie_cfg_init(in_stack_fffffffffffff7c8);
  len = (int)((ulong)in_stack_fffffffffffff7c8 >> 0x20);
  if (iVar1 < 0) {
    perror("nettlp_pcie_cfg_init");
    return -1;
  }
  sVar2 = nettlp_pcie_cfg_read
                    (in_stack_fffffffffffff808,in_stack_fffffffffffff806,in_stack_fffffffffffff7f8,
                     in_stack_fffffffffffff7f0);
  if ((int)sVar2 < 0) {
    perror("nettlp_pcie_cfg_read");
    return -1;
  }
  hexdump(in_stack_fffffffffffff7d0,len);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
	int ret, ch;
	char buf[2048];
	int size = 0;
	uint16_t addr = 0;
	struct nettlp_pcie_cfg ntpc;

	memset(buf, 0, sizeof(buf));
	memset(&ntpc, 0, sizeof(ntpc));

	while ((ch = getopt(argc, argv, "r:l:a:s:h")) != -1) {
		switch (ch) {
		case 'r':
			ret = inet_pton(AF_INET, optarg, &ntpc.remote_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'l':
			ret = inet_pton(AF_INET, optarg, &ntpc.local_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'a':
			ret = sscanf(optarg, "0x%hx", &addr);
			if (ret < 1) {
				fprintf(stderr, "invalid address\n");
				return -1;
			}
			break;
				
		case 's':
			size = atoi(optarg);
			if (size < 1 || size > sizeof(buf)) {
				fprintf(stderr, "invalid size\n");
				return -1;
			}
			break;

		case 'h':
		default:
			usage();
			return -1;
		}
	}

	ret = nettlp_pcie_cfg_init(&ntpc);
	if (ret < 0) {
		perror("nettlp_pcie_cfg_init");
		return -1;
	}

	ret = nettlp_pcie_cfg_read(&ntpc, addr, buf, size);
	if (ret < 0) {
		perror("nettlp_pcie_cfg_read");
		return -1;
	}
	
	hexdump(buf, size);

	return 0;
}